

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O2

shared_ptr<duckdb::CSVBuffer,_true> __thiscall
duckdb::CSVBuffer::Next
          (CSVBuffer *this,CSVFileHandle *file_handle,idx_t buffer_size,bool *has_seaked)

{
  undefined8 uVar1;
  CSVBuffer *pCVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_R8;
  shared_ptr<duckdb::CSVBuffer,_true> sVar3;
  shared_ptr<duckdb::CSVBuffer,_true> next_csv_buffer;
  undefined1 local_48 [16];
  unsigned_long local_38 [2];
  unsigned_long local_28;
  
  local_38[0] = (unsigned_long)has_seaked;
  if (*in_R8 == '\x01') {
    CSVFileHandle::Seek((CSVFileHandle *)buffer_size,
                        (long)&((file_handle->main_mutex).super___mutex_base._M_mutex.__data.__list.
                               __next)->__prev +
                        *(long *)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex +
                                 0x10));
    *in_R8 = '\0';
  }
  local_28 = (long)&((file_handle->main_mutex).super___mutex_base._M_mutex.__data.__list.__next)->
                    __prev +
             *(long *)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 0x10);
  local_38[1] = (long)&((file_handle->file_handle).
                        super_unique_ptr<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::FileHandle,_std::default_delete<duckdb::FileHandle>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::FileHandle_*,_std::default_delete<duckdb::FileHandle>_>
                        .super__Head_base<0UL,_duckdb::FileHandle_*,_false>._M_head_impl)->
                       _vptr_FileHandle + 1;
  make_shared_ptr<duckdb::CSVBuffer,duckdb::CSVFileHandle&,duckdb::ClientContext&,unsigned_long&,unsigned_long,unsigned_long>
            ((CSVFileHandle *)local_48,(ClientContext *)buffer_size,
             *(unsigned_long **)((long)&(file_handle->main_mutex).super___mutex_base._M_mutex + 8),
             local_38,&local_28);
  pCVar2 = shared_ptr<duckdb::CSVBuffer,_true>::operator->
                     ((shared_ptr<duckdb::CSVBuffer,_true> *)local_48);
  uVar1 = local_48._8_8_;
  if (pCVar2->actual_buffer_size == 0) {
    *(undefined8 *)this = 0;
    this->context = (ClientContext *)0x0;
  }
  else {
    local_48._8_8_ = (ClientContext *)0x0;
    *(undefined8 *)this = local_48._0_8_;
    this->context = (ClientContext *)uVar1;
    local_48._0_8_ = 0;
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::CSVBuffer,_true>)
         sVar3.internal.super___shared_ptr<duckdb::CSVBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<CSVBuffer> CSVBuffer::Next(CSVFileHandle &file_handle, idx_t buffer_size, bool &has_seaked) const {
	if (has_seaked) {
		// This means that at some point a reload was done, and we are currently on the incorrect position in our file
		// handle
		file_handle.Seek(global_csv_start + actual_buffer_size);
		has_seaked = false;
	}
	auto next_csv_buffer = make_shared_ptr<CSVBuffer>(file_handle, context, buffer_size,
	                                                  global_csv_start + actual_buffer_size, buffer_idx + 1);
	if (next_csv_buffer->GetBufferSize() == 0) {
		// We are done reading
		return nullptr;
	}
	return next_csv_buffer;
}